

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  bool *pbVar3;
  char *pcVar4;
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(");
  pcVar4 = "isolines";
  if (*(int *)((long)this + 0x78) == 1) {
    pcVar4 = "quads";
  }
  pcVar2 = "triangles";
  if (*(int *)((long)this + 0x78) != 0) {
    pcVar2 = pcVar4;
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pbVar3 = (bool *)0x826a31;
  if (*(int *)((long)this + 0x7c) == 0) {
    pbVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar1 = std::operator<<(poVar1,pbVar3);
  std::operator<<(poVar1,
                  ") in;\n\nout highp vec4 v_tessellationCoords;\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n\tif (gl_PatchVerticesIn != 9)\n\t\treturn;\n\n\tvec4 patchCentroid = vec4(0.0);\n\tfor (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n\t\tpatchCentroid += gl_in[ndx].gl_Position;\n\tpatchCentroid /= patchCentroid.w;\n\n"
                 );
  if ((ulong)*(uint *)((long)this + 0x78) < 3) {
    std::operator<<((ostream *)local_190,
                    &DAT_0083c0f0 +
                    *(int *)(&DAT_0083c0f0 + (ulong)*(uint *)((long)this + 0x78) * 4));
  }
  std::operator<<((ostream *)local_190,"\tv_tessellationCoords = vec4(gl_TessCoord, 0.0);\n}\n");
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getTessellationEvaluationSource (void) const
{
	std::ostringstream buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_TESSELATION_SHADER}"
			"layout("
				<< ((m_tessellationOutput == TESSELLATION_OUT_TRIANGLES) ? ("triangles") : (m_tessellationOutput == TESSELLATION_OUT_QUADS) ? ("quads") : ("isolines"))
				<< ((m_tessellationPointMode) ? (", point_mode") : (""))
				<< ") in;\n"
			"\n"
			"out highp vec4 v_tessellationCoords;\n"
			"\n"
			"// note: No need to use precise gl_Position since we do not require gapless geometry\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_PatchVerticesIn != 9)\n"
			"		return;\n"
			"\n"
			"	vec4 patchCentroid = vec4(0.0);\n"
			"	for (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n"
			"		patchCentroid += gl_in[ndx].gl_Position;\n"
			"	patchCentroid /= patchCentroid.w;\n"
			"\n";

	if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
		buf <<	"	// map barycentric coords to 2d coords\n"
				"	const vec3 tessDirX = vec3( 0.4,  0.4, 0.0);\n"
				"	const vec3 tessDirY = vec3( 0.0, -0.4, 0.0);\n"
				"	const vec3 tessDirZ = vec3(-0.4,  0.4, 0.0);\n"
				"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * tessDirX + gl_TessCoord.y * tessDirY + gl_TessCoord.z * tessDirZ, 0.0);\n";
	else if (m_tessellationOutput == TESSELLATION_OUT_QUADS || m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
		buf <<	"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * 0.8 - 0.4, gl_TessCoord.y * 0.8 - 0.4, 0.0, 0.0);\n";
	else
		DE_ASSERT(false);

	buf <<	"	v_tessellationCoords = vec4(gl_TessCoord, 0.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}